

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vr2i.cpp
# Opt level: O1

bool * __thiscall Vr2i::steps(Vr2i *this,int *n)

{
  uint uVar1;
  bool *pbVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  
  uVar3 = this->xv;
  uVar7 = this->yv;
  uVar1 = -uVar3;
  if (0 < (int)uVar3) {
    uVar1 = uVar3;
  }
  uVar3 = -uVar7;
  if (0 < (int)uVar7) {
    uVar3 = uVar7;
  }
  uVar7 = uVar1;
  if (uVar3 < uVar1) {
    uVar7 = uVar3;
  }
  if (uVar3 <= uVar1) {
    uVar3 = uVar1;
  }
  uVar5 = (ulong)uVar3;
  *n = uVar3;
  pbVar2 = (bool *)operator_new__(uVar5);
  if (uVar3 != 0) {
    uVar8 = 0;
    uVar6 = uVar5;
    do {
      iVar4 = (int)uVar6 + uVar7 * -2;
      uVar6 = (ulong)(iVar4 + (iVar4 >> 0x1f & uVar3 * 2));
      pbVar2[uVar8] = SUB41((uint)iVar4 >> 0x1f,0);
      uVar8 = uVar8 + 1;
    } while (uVar5 != uVar8);
  }
  return pbVar2;
}

Assistant:

bool *Vr2i::steps (int *n) const
{
  int x2 = (xv > 0 ? xv : - xv);
  int y2 = (yv > 0 ? yv : - yv);
  int dx = x2, dy = y2;
  if (y2 > x2)
  {
    dx = y2;
    dy = x2;
    x2 = y2;
  }
  int e, x = 0, i = 0;
  *n = x2;
  bool *vecsteps = new bool[x2];

  e = dx;
  dx *= 2;
  dy *= 2;

  while (x < x2)
  {
    x ++;
    e -= dy;
    if (e < 0)
    {
      e += dx;
      vecsteps[i++] = true;
    }
    else vecsteps[i++] = false;
  }
  return (vecsteps); 
}